

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkheader.cpp
# Opt level: O3

QByteArray * __thiscall
QHttpNetworkHeaderPrivate::headerField
          (QByteArray *__return_storage_ptr__,QHttpNetworkHeaderPrivate *this,QByteArrayView name,
          QByteArray *defaultValue)

{
  Data *pDVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QByteArray> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  QHttpHeaderParser::headerFieldValues((QList<QByteArray> *)&local_38,&this->parser,name);
  if ((undefined1 *)local_38.size == (undefined1 *)0x0) {
    pDVar1 = (defaultValue->d).d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (defaultValue->d).ptr;
    (__return_storage_ptr__->d).size = (defaultValue->d).size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    QtPrivate::QByteArrayList_join((QList *)__return_storage_ptr__,(char *)&local_38,0x25db8c);
  }
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QHttpNetworkHeaderPrivate::headerField(QByteArrayView name, const QByteArray &defaultValue) const
{
    QList<QByteArray> allValues = headerFieldValues(name);
    if (allValues.isEmpty())
        return defaultValue;
    else
        return allValues.join(", ");
}